

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

plugin loader_get_impl_plugin(char *tag)

{
  int iVar1;
  loader_impl impl_00;
  plugin p_00;
  plugin in_RDI;
  loader_impl impl;
  plugin p;
  loader_impl in_stack_00000058;
  loader_impl in_stack_ffffffffffffffd8;
  plugin local_8;
  
  local_8 = (plugin)plugin_manager_get(&loader_manager,in_RDI);
  if (local_8 == (plugin)0x0) {
    impl_00 = loader_impl_create((char *)in_stack_ffffffffffffffd8);
    if (impl_00 != (loader_impl)0x0) {
      iVar1 = loader_impl_get_option_host(in_stack_ffffffffffffffd8);
      if (iVar1 == 0) {
        loader_impl_dependencies(in_stack_00000058);
      }
      p_00 = (plugin)plugin_manager_create(&loader_manager,in_RDI,impl_00,loader_impl_destroy_dtor);
      if (p_00 != (plugin)0x0) {
        loader_impl_attach(impl_00,p_00);
        return p_00;
      }
      loader_impl_destroy(in_RDI,(loader_impl)0x0);
    }
    log_write_impl_va("metacall",0x124,"loader_get_impl_plugin",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                      ,3,"Failed to create loader: %s",in_RDI);
    local_8 = (plugin)0x0;
  }
  return local_8;
}

Assistant:

plugin loader_get_impl_plugin(const loader_tag tag)
{
	plugin p = plugin_manager_get(&loader_manager, tag);

	if (p != NULL)
	{
		return p;
	}

	loader_impl impl = loader_impl_create(tag);

	if (impl == NULL)
	{
		goto loader_create_error;
	}

	/* Dynamic link loader dependencies if it is not host */
	if (loader_impl_get_option_host(impl) == 0)
	{
		loader_impl_dependencies(impl);
	}

	/* Dynamic link the loader */
	p = plugin_manager_create(&loader_manager, tag, impl, &loader_impl_destroy_dtor);

	if (p == NULL)
	{
		goto plugin_manager_create_error;
	}

	/* Store in the loader implementation the reference to the plugin which belongs to */
	loader_impl_attach(impl, p);

	/* TODO: Disable logs here until log is completely thread safe and async signal safe */
	/* log_write("metacall", LOG_LEVEL_DEBUG, "Created loader (%s) implementation <%p>", tag, (void *)impl); */

	return p;

plugin_manager_create_error:
	loader_impl_destroy(p, impl);
loader_create_error:
	log_write("metacall", LOG_LEVEL_ERROR, "Failed to create loader: %s", tag);
	return NULL;
}